

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O2

void __thiscall ncnn::Gemm::Gemm(Gemm *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Gemm_005a3970;
  (this->A_data_int8_scales).cstep = 0;
  (this->super_Layer).one_blob_only = false;
  (this->super_Layer).support_inplace = false;
  (this->A_data).data = (void *)0x0;
  (this->A_data).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->A_data).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->A_data).elemsize + 4) = 0;
  (this->A_data).allocator = (Allocator *)0x0;
  (this->A_data).dims = 0;
  (this->A_data).w = 0;
  (this->A_data).w = 0;
  (this->A_data).h = 0;
  (this->A_data).d = 0;
  (this->A_data).c = 0;
  (this->A_data).cstep = 0;
  (this->B_data).data = (void *)0x0;
  (this->B_data).refcount = (int *)0x0;
  (this->B_data).elemsize = 0;
  (this->B_data).elempack = 0;
  (this->B_data).allocator = (Allocator *)0x0;
  (this->B_data).dims = 0;
  (this->B_data).w = 0;
  (this->B_data).w = 0;
  (this->B_data).h = 0;
  (this->B_data).d = 0;
  (this->B_data).c = 0;
  (this->B_data).cstep = 0;
  (this->C_data).data = (void *)0x0;
  (this->C_data).refcount = (int *)0x0;
  (this->C_data).elemsize = 0;
  (this->C_data).elempack = 0;
  (this->C_data).allocator = (Allocator *)0x0;
  (this->C_data).dims = 0;
  (this->C_data).w = 0;
  (this->C_data).w = 0;
  (this->C_data).h = 0;
  (this->C_data).d = 0;
  (this->C_data).c = 0;
  (this->A_data_int8_scales).elempack = 0;
  (this->C_data).cstep = 0;
  (this->A_data_int8_scales).data = (void *)0x0;
  (this->A_data_int8_scales).refcount = (int *)0x0;
  (this->A_data_int8_scales).elemsize = 0;
  (this->A_data_int8_scales).w = 0;
  (this->A_data_int8_scales).h = 0;
  (this->A_data_int8_scales).d = 0;
  (this->A_data_int8_scales).c = 0;
  (this->A_data_int8_scales).allocator = (Allocator *)0x0;
  (this->A_data_int8_scales).dims = 0;
  (this->A_data_int8_scales).w = 0;
  return;
}

Assistant:

Gemm::Gemm()
{
    one_blob_only = false;
    support_inplace = false;
}